

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Shader.cpp
# Opt level: O1

void __thiscall sf::Shader::bindTextures(Shader *this)

{
  ulong uVar1;
  _Base_ptr p_Var2;
  socklen_t __len;
  ulong uVar3;
  
  if ((this->m_textures)._M_t._M_impl.super__Rb_tree_header._M_node_count != 0) {
    p_Var2 = (this->m_textures)._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
    uVar3 = 0;
    do {
      uVar1 = uVar3 + 1;
      (*sf_ptrc_glUniform1iARB)(p_Var2[1]._M_color,(GLint)uVar1);
      priv::glCheckError("/workspace/llm4binary/github/license_all_cmakelists_25/johnor[P]n_e_s_vis/build_O1/_deps/sfml-src/src/SFML/Graphics/Shader.cpp"
                         ,0x3d2,"GLEXT_glUniform1i(it->first, index)");
      (*sf_ptrc_glActiveTextureARB)((int)uVar3 + 0x84c1);
      priv::glCheckError("/workspace/llm4binary/github/license_all_cmakelists_25/johnor[P]n_e_s_vis/build_O1/_deps/sfml-src/src/SFML/Graphics/Shader.cpp"
                         ,0x3d3,"GLEXT_glActiveTexture(GLEXT_GL_TEXTURE0 + index)");
      Texture::bind((int)p_Var2[1]._M_parent,(sockaddr *)0x0,__len);
      p_Var2 = (_Base_ptr)std::_Rb_tree_increment(p_Var2);
      uVar3 = uVar1;
    } while (uVar1 < (this->m_textures)._M_t._M_impl.super__Rb_tree_header._M_node_count);
  }
  (*sf_ptrc_glActiveTextureARB)(0x84c0);
  priv::glCheckError("/workspace/llm4binary/github/license_all_cmakelists_25/johnor[P]n_e_s_vis/build_O1/_deps/sfml-src/src/SFML/Graphics/Shader.cpp"
                     ,0x3d9,"GLEXT_glActiveTexture(GLEXT_GL_TEXTURE0)");
  return;
}

Assistant:

void Shader::bindTextures() const
{
    TextureTable::const_iterator it = m_textures.begin();
    for (std::size_t i = 0; i < m_textures.size(); ++i)
    {
        GLint index = static_cast<GLsizei>(i + 1);
        glCheck(GLEXT_glUniform1i(it->first, index));
        glCheck(GLEXT_glActiveTexture(GLEXT_GL_TEXTURE0 + index));
        Texture::bind(it->second);
        ++it;
    }

    // Make sure that the texture unit which is left active is the number 0
    glCheck(GLEXT_glActiveTexture(GLEXT_GL_TEXTURE0));
}